

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O1

int main(void)

{
  writeimage();
  writeascii();
  writebintable();
  copyhdu();
  selectrows();
  readheader();
  readimage();
  readtable();
  puts("\nAll the cfitsio cookbook routines ran successfully.");
  return 0;
}

Assistant:

int main()
{
/*************************************************************************
   This is a simple main program that calls the following routines:

    writeimage    - write a FITS primary array image
    writeascii    - write a FITS ASCII table extension
    writebintable - write a FITS binary table extension
    copyhdu       - copy a header/data unit from one FITS file to another
    selectrows    - copy selected row from one HDU to another
    readheader    - read and print the header keywords in every extension
    readimage     - read a FITS image and compute the min and max value
    readtable     - read columns of data from ASCII and binary tables

**************************************************************************/

    writeimage();
    writeascii();
    writebintable();
    copyhdu();
    selectrows();
    readheader();
    readimage();
    readtable();

    printf("\nAll the cfitsio cookbook routines ran successfully.\n");
    return(0);
}